

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_interface.cc
# Opt level: O0

void __thiscall sentencepiece::ModelInterface::InitializePieces(ModelInterface *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ModelProto_SentencePiece_Type MVar4;
  ulong uVar5;
  string *psVar6;
  TrainerSpec *pTVar7;
  string_view piece;
  first_type fVar8;
  value_type vVar9;
  pair<std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool>
  pVar10;
  undefined1 auVar11 [16];
  reference rVar12;
  iterator iVar13;
  _Bit_iterator _Var14;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  _Bit_iterator __last;
  PieceToIdMap *local_338;
  bool local_325;
  bool local_2fd;
  undefined1 local_2d8 [8];
  basic_string_view<char,_std::char_traits<char>_> local_2d0;
  Status local_2c0;
  _Base_ptr local_2b8;
  uint local_2b0;
  _Bit_iterator_base local_2a8;
  _Bit_type *local_298;
  uint local_290;
  bool local_281;
  _Bit_type *local_280;
  uint local_278;
  _Bit_type *local_270;
  uint local_268;
  _Bit_type *local_260;
  uint local_258;
  _Bit_type *local_250;
  uint local_248;
  _Bit_iterator_base local_240;
  basic_string_view<char,_std::char_traits<char>_> local_230;
  Status local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined1 local_1d8 [16];
  Status local_1c8;
  reference local_1c0;
  undefined1 local_1b0 [16];
  int local_19c;
  undefined1 local_198 [4];
  int byte;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [16];
  Status local_148;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  Status local_130;
  _Base_ptr local_128;
  undefined1 local_120;
  value_type local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [16];
  Status local_d8;
  first_type local_d0;
  bool local_bd;
  undefined4 local_bc;
  undefined1 auStack_b8 [3];
  bool is_normal_piece_1;
  Status local_a8;
  ModelProto_SentencePiece *local_a0;
  ModelProto_SentencePiece *sp_1;
  int i_1;
  bool is_normal_piece;
  ModelProto_SentencePiece *sp;
  int i;
  int reserved_id_map_size;
  int pieces_size;
  allocator<bool> local_6a;
  bool local_69;
  undefined1 local_68 [8];
  vector<bool,_std::allocator<bool>_> byte_found;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  user_defined_symbols;
  ModelInterface *this_local;
  
  std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::clear(&this->pieces_);
  std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::clear(&this->reserved_id_map_);
  this->unk_id_ = -1;
  std::
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         *)&byte_found.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage);
  local_69 = false;
  std::allocator<bool>::allocator(&local_6a);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_68,0x100,&local_69,&local_6a);
  std::allocator<bool>::~allocator(&local_6a);
  i = 0;
  sp._4_4_ = 0;
  for (sp._0_4_ = 0; iVar1 = (int)sp, iVar3 = ModelProto::pieces_size(this->model_proto_),
      iVar1 < iVar3; sp._0_4_ = (int)sp + 1) {
    _i_1 = ModelProto::pieces(this->model_proto_,(int)sp);
    MVar4 = ModelProto_SentencePiece::type(_i_1);
    local_2fd = true;
    if (MVar4 != ModelProto_SentencePiece_Type_NORMAL) {
      MVar4 = ModelProto_SentencePiece::type(_i_1);
      local_2fd = true;
      if (MVar4 != ModelProto_SentencePiece_Type_USER_DEFINED) {
        MVar4 = ModelProto_SentencePiece::type(_i_1);
        local_2fd = MVar4 == ModelProto_SentencePiece_Type_UNUSED;
      }
    }
    sp_1._7_1_ = local_2fd;
    if (local_2fd == false) {
      sp._4_4_ = sp._4_4_ + 1;
    }
    else {
      i = i + 1;
    }
  }
  std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::reserve(&this->pieces_,(long)i);
  std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::reserve(&this->reserved_id_map_,(long)sp._4_4_);
  sp_1._0_4_ = 0;
  while( true ) {
    iVar1 = (int)sp_1;
    iVar3 = ModelProto::pieces_size(this->model_proto_);
    if (iVar3 <= iVar1) break;
    local_a0 = ModelProto::pieces(this->model_proto_,(int)sp_1);
    ModelProto_SentencePiece::piece_abi_cxx11_(local_a0);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_b8,
                 "piece must not be empty.");
      str._M_str = _auStack_b8;
      str._M_len = (size_t)&local_a8;
      util::InternalError(str);
      util::Status::operator=(&this->status_,&local_a8);
      util::Status::~Status(&local_a8);
      local_bc = 1;
      goto LAB_002e481f;
    }
    MVar4 = ModelProto_SentencePiece::type(local_a0);
    local_325 = true;
    if (MVar4 != ModelProto_SentencePiece_Type_NORMAL) {
      MVar4 = ModelProto_SentencePiece::type(local_a0);
      local_325 = true;
      if (MVar4 != ModelProto_SentencePiece_Type_USER_DEFINED) {
        MVar4 = ModelProto_SentencePiece::type(local_a0);
        local_325 = MVar4 == ModelProto_SentencePiece_Type_UNUSED;
      }
    }
    local_bd = local_325;
    if (local_325 == false) {
      local_338 = &this->reserved_id_map_;
    }
    else {
      local_338 = &this->pieces_;
    }
    psVar6 = ModelProto_SentencePiece::piece_abi_cxx11_(local_a0);
    fVar8 = (first_type)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    local_d0 = fVar8;
    bVar2 = port::
            InsertIfNotPresent<std::unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>>>
                      (local_338,&local_d0,(second_type *)&sp_1);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      psVar6 = ModelProto_SentencePiece::piece_abi_cxx11_(local_a0);
      std::operator+(&local_108,psVar6," is already defined.");
      local_e8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_108);
      str_00._M_str = local_e8._0_8_;
      str_00._M_len = (size_t)&local_d8;
      util::InternalError(str_00);
      util::Status::operator=(&this->status_,&local_d8);
      util::Status::~Status(&local_d8);
      std::__cxx11::string::~string((string *)&local_108);
      local_bc = 1;
      goto LAB_002e481f;
    }
    MVar4 = ModelProto_SentencePiece::type(local_a0);
    if (MVar4 == ModelProto_SentencePiece_Type_USER_DEFINED) {
      psVar6 = ModelProto_SentencePiece::piece_abi_cxx11_(local_a0);
      vVar9 = (value_type)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6)
      ;
      local_118 = vVar9;
      pVar10 = std::
               set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::insert((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)&byte_found.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage,&local_118);
      local_128 = (_Base_ptr)pVar10.first._M_node;
      local_120 = pVar10.second;
    }
    MVar4 = ModelProto_SentencePiece::type(local_a0);
    if (MVar4 == ModelProto_SentencePiece_Type_UNKNOWN) {
      if (-1 < this->unk_id_) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_140,"unk is already defined.");
        str_01._M_str = (char *)local_140._M_len;
        str_01._M_len = (size_t)&local_130;
        util::InternalError(str_01);
        util::Status::operator=(&this->status_,&local_130);
        util::Status::~Status(&local_130);
        local_bc = 1;
        goto LAB_002e481f;
      }
      this->unk_id_ = (int)sp_1;
    }
    MVar4 = ModelProto_SentencePiece::type(local_a0);
    if (MVar4 == ModelProto_SentencePiece_Type_BYTE) {
      pTVar7 = ModelProto::trainer_spec(this->model_proto_);
      bVar2 = TrainerSpec::byte_fallback(pTVar7);
      if (!bVar2) {
        psVar6 = ModelProto_SentencePiece::piece_abi_cxx11_(local_a0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_198,"byte piece ",psVar6);
        std::operator+(&local_178,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_198," is found although `byte_fallback` is false.");
        local_158 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_178);
        str_02._M_str = local_158._0_8_;
        str_02._M_len = (size_t)&local_148;
        util::InternalError(str_02);
        util::Status::operator=(&this->status_,&local_148);
        util::Status::~Status(&local_148);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)local_198);
        local_bc = 1;
        goto LAB_002e481f;
      }
      psVar6 = ModelProto_SentencePiece::piece_abi_cxx11_(local_a0);
      auVar11 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
      piece._M_str = auVar11._8_8_;
      piece._M_len = (size_t)piece._M_str;
      local_1b0 = auVar11;
      local_19c = PieceToByte(auVar11._0_8_,piece);
      if ((local_19c < 0) || (0xff < local_19c)) {
        psVar6 = ModelProto_SentencePiece::piece_abi_cxx11_(local_a0);
        std::operator+(&local_218,"byte piece ",psVar6);
        std::operator+(&local_1f8,&local_218," is invalid.");
        local_1d8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1f8);
        str_03._M_str = local_1d8._0_8_;
        str_03._M_len = (size_t)&local_1c8;
        util::InternalError(str_03);
        util::Status::operator=(&this->status_,&local_1c8);
        util::Status::~Status(&local_1c8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_218);
        local_bc = 1;
        goto LAB_002e481f;
      }
      rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_68,(long)local_19c);
      local_1c0 = rVar12;
      std::_Bit_reference::operator=(&local_1c0,true);
    }
    sp_1._0_4_ = (int)sp_1 + 1;
  }
  if (this->unk_id_ == -1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_230,"unk is not defined.");
    str_04._M_str = (char *)local_230._M_len;
    str_04._M_len = (size_t)&local_220;
    util::InternalError(str_04);
    util::Status::operator=(&this->status_,&local_220);
    util::Status::~Status(&local_220);
    local_bc = 1;
  }
  else {
    pTVar7 = ModelProto::trainer_spec(this->model_proto_);
    bVar2 = TrainerSpec::byte_fallback(pTVar7);
    if (bVar2) {
      iVar13 = std::vector<bool,_std::allocator<bool>_>::begin
                         ((vector<bool,_std::allocator<bool>_> *)local_68);
      local_260 = iVar13.super__Bit_iterator_base._M_p;
      local_258 = iVar13.super__Bit_iterator_base._M_offset;
      local_250 = local_260;
      local_248 = local_258;
      iVar13 = std::vector<bool,_std::allocator<bool>_>::end
                         ((vector<bool,_std::allocator<bool>_> *)local_68);
      local_280 = iVar13.super__Bit_iterator_base._M_p;
      local_278 = iVar13.super__Bit_iterator_base._M_offset;
      local_281 = false;
      _Var14.super__Bit_iterator_base._M_offset = local_248;
      _Var14.super__Bit_iterator_base._M_p = local_250;
      _Var14.super__Bit_iterator_base._12_4_ = 0;
      __last.super__Bit_iterator_base._12_4_ = 0;
      __last.super__Bit_iterator_base._M_p =
           (_Bit_type *)SUB128(iVar13.super__Bit_iterator_base._0_12_,0);
      __last.super__Bit_iterator_base._M_offset = SUB124(iVar13.super__Bit_iterator_base._0_12_,8);
      local_270 = local_280;
      local_268 = local_278;
      _Var14 = std::find<std::_Bit_iterator,bool>(_Var14,__last,&local_281);
      local_298 = _Var14.super__Bit_iterator_base._M_p;
      local_290 = _Var14.super__Bit_iterator_base._M_offset;
      local_240._M_p = local_298;
      local_240._M_offset = local_290;
      iVar13 = std::vector<bool,_std::allocator<bool>_>::end
                         ((vector<bool,_std::allocator<bool>_> *)local_68);
      local_2b8 = (_Base_ptr)iVar13.super__Bit_iterator_base._M_p;
      local_2b0 = iVar13.super__Bit_iterator_base._M_offset;
      local_2a8._M_p = (_Bit_type *)local_2b8;
      local_2a8._M_offset = local_2b0;
      bVar2 = std::operator!=(&local_240,&local_2a8);
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_2d0,"there are not 256 byte pieces although `byte_fallback` is true.");
        str_05._M_str = (char *)local_2d0._M_len;
        str_05._M_len = (size_t)&local_2c0;
        util::InternalError(str_05);
        util::Status::operator=(&this->status_,&local_2c0);
        util::Status::~Status(&local_2c0);
        local_bc = 1;
        goto LAB_002e481f;
      }
    }
    std::
    make_unique<sentencepiece::normalizer::PrefixMatcher,std::set<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&>
              ((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)local_2d8);
    std::
    unique_ptr<sentencepiece::normalizer::PrefixMatcher,_std::default_delete<sentencepiece::normalizer::PrefixMatcher>_>
    ::operator=(&this->matcher_,
                (unique_ptr<sentencepiece::normalizer::PrefixMatcher,_std::default_delete<sentencepiece::normalizer::PrefixMatcher>_>
                 *)local_2d8);
    std::
    unique_ptr<sentencepiece::normalizer::PrefixMatcher,_std::default_delete<sentencepiece::normalizer::PrefixMatcher>_>
    ::~unique_ptr((unique_ptr<sentencepiece::normalizer::PrefixMatcher,_std::default_delete<sentencepiece::normalizer::PrefixMatcher>_>
                   *)local_2d8);
    local_bc = 0;
  }
LAB_002e481f:
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_68)
  ;
  std::
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *)&byte_found.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage);
  return;
}

Assistant:

void ModelInterface::InitializePieces() {
  pieces_.clear();
  reserved_id_map_.clear();
  unk_id_ = -1;

  std::set<absl::string_view> user_defined_symbols;
  std::vector<bool> byte_found(256, false);

  int pieces_size = 0;
  int reserved_id_map_size = 0;
  for (int i = 0; i < model_proto_->pieces_size(); ++i) {
    const auto &sp = model_proto_->pieces(i);
    const bool is_normal_piece =
        (sp.type() == ModelProto::SentencePiece::NORMAL ||
         sp.type() == ModelProto::SentencePiece::USER_DEFINED ||
         sp.type() == ModelProto::SentencePiece::UNUSED);
    if (is_normal_piece) {
      ++pieces_size;
    } else {
      ++reserved_id_map_size;
    }
  }
  pieces_.reserve(pieces_size);
  reserved_id_map_.reserve(reserved_id_map_size);

  for (int i = 0; i < model_proto_->pieces_size(); ++i) {
    const auto &sp = model_proto_->pieces(i);
    if (sp.piece().empty()) {
      status_ = util::InternalError("piece must not be empty.");
      return;
    }

    const bool is_normal_piece =
        (sp.type() == ModelProto::SentencePiece::NORMAL ||
         sp.type() == ModelProto::SentencePiece::USER_DEFINED ||
         sp.type() == ModelProto::SentencePiece::UNUSED);
    if (!port::InsertIfNotPresent(
            is_normal_piece ? &pieces_ : &reserved_id_map_, sp.piece(), i)) {
      status_ = util::InternalError(sp.piece() + " is already defined.");
      return;
    }

    if (sp.type() == ModelProto::SentencePiece::USER_DEFINED) {
      user_defined_symbols.insert(sp.piece());
    }

    if (sp.type() == ModelProto::SentencePiece::UNKNOWN) {
      if (unk_id_ >= 0) {
        status_ = util::InternalError("unk is already defined.");
        return;
      }
      unk_id_ = i;
    }

    if (sp.type() == ModelProto::SentencePiece::BYTE) {
      if (!model_proto_->trainer_spec().byte_fallback()) {
        status_ =
            util::InternalError("byte piece " + sp.piece() +
                                " is found although `byte_fallback` is false.");
        return;
      }
      const int byte = PieceToByte(sp.piece());
      if (0 <= byte && byte < 256) {
        byte_found[byte] = true;
      } else {
        status_ =
            util::InternalError("byte piece " + sp.piece() + " is invalid.");
        return;
      }
    }
  }

  if (unk_id_ == -1) {
    status_ = util::InternalError("unk is not defined.");
    return;
  }

  if (model_proto_->trainer_spec().byte_fallback()) {
    // Checks that there are 256 byte pieces.
    if (std::find(byte_found.begin(), byte_found.end(), false) !=
        byte_found.end()) {
      status_ = util::InternalError(
          "there are not 256 byte pieces although `byte_fallback` is true.");
      return;
    }
  }

  matcher_ = std::make_unique<normalizer::PrefixMatcher>(user_defined_symbols);
}